

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

uint8_t * BrotliEncoderTakeOutput(BrotliEncoderState *s,size_t *size)

{
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *result;
  size_t consumed_size;
  size_t *size_local;
  BrotliEncoderState *s_local;
  
  result = (uint8_t *)s->available_out_;
  local_38 = s->next_out_;
  if (*size != 0) {
    local_40 = (uint8_t *)s->available_out_;
    if ((uint8_t *)*size < local_40) {
      local_40 = (uint8_t *)*size;
    }
    result = local_40;
  }
  if (result == (uint8_t *)0x0) {
    *size = 0;
    local_38 = (uint8_t *)0x0;
  }
  else {
    s->next_out_ = result + (long)s->next_out_;
    s->available_out_ = s->available_out_ - (long)result;
    s->total_out_ = (size_t)(result + s->total_out_);
    CheckFlushComplete(s);
    *size = (size_t)result;
  }
  return local_38;
}

Assistant:

const uint8_t* BrotliEncoderTakeOutput(BrotliEncoderState* s, size_t* size) {
  size_t consumed_size = s->available_out_;
  uint8_t* result = s->next_out_;
  if (*size) {
    consumed_size = BROTLI_MIN(size_t, *size, s->available_out_);
  }
  if (consumed_size) {
    s->next_out_ += consumed_size;
    s->available_out_ -= consumed_size;
    s->total_out_ += consumed_size;
    CheckFlushComplete(s);
    *size = consumed_size;
  } else {
    *size = 0;
    result = 0;
  }
  return result;
}